

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::NewSlot(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  SQChar *pSVar6;
  SQChar *pSVar7;
  SQMetaMethod mm;
  SQMetaMethod mm_00;
  char *s;
  SQTable *pSVar8;
  bool bVar9;
  SQObjectPtr res;
  SQObjectPtr closure;
  
  if (((self->super_SQObject)._flags & 1) != 0) {
    pSVar6 = GetTypeName(self);
    Raise_Error(this,"trying to modify immutable \'%s\'",pSVar6);
    return false;
  }
  if ((key->super_SQObject)._type == OT_NULL) {
    s = "null cannot be used as index";
LAB_001398ce:
    bVar9 = false;
    Raise_Error(this,s);
  }
  else {
    SVar2 = (self->super_SQObject)._type;
    if (SVar2 == OT_CLASS) {
      bVar9 = SQClass::NewSlot((self->super_SQObject)._unVal.pClass,this->_sharedstate,key,val,
                               bstatic);
      if (!bVar9) {
        if (((self->super_SQObject)._unVal.pClass)->_lockedTypeId == 0) {
          res.super_SQObject._unVal.pString = PrintObjVal(this,key);
          res.super_SQObject._type = OT_STRING;
          res.super_SQObject._flags = '\0';
          pSVar1 = &((res.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                    super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
          Raise_Error(this,"the property \'%s\' already exists",
                      &(res.super_SQObject._unVal.pTable)->_firstfree);
          goto LAB_00139b65;
        }
        s = 
        "trying to modify a class that has already been instantiated, inherited or is locked manually"
        ;
        goto LAB_001398ce;
      }
    }
    else if (SVar2 == OT_INSTANCE) {
      res.super_SQObject._unVal.pTable = (SQTable *)0x0;
      res.super_SQObject._type = OT_NULL;
      res.super_SQObject._flags = '\0';
      res.super_SQObject._5_3_ = 0;
      closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
      closure.super_SQObject._type = OT_NULL;
      closure.super_SQObject._flags = '\0';
      closure.super_SQObject._5_3_ = 0;
      pSVar8 = (self->super_SQObject)._unVal.pTable;
      if (((pSVar8->super_SQDelegable)._delegate == (SQTable *)0x0) ||
         (iVar5 = (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _vptr_SQRefCounted[6])(pSVar8,this,0xd,&closure), (char)iVar5 == '\0')) {
        Raise_Error(this,"class instances do not support the new slot operator");
        SQObjectPtr::~SQObjectPtr(&closure);
LAB_00139b65:
        SQObjectPtr::~SQObjectPtr(&res);
        return false;
      }
      Push(this,self);
      Push(this,key);
      Push(this,val);
      bVar9 = CallMetaMethod(this,&closure,mm_00,3,&res);
      SQObjectPtr::~SQObjectPtr(&closure);
      SQObjectPtr::~SQObjectPtr(&res);
      if (!bVar9) {
        return false;
      }
    }
    else {
      if (SVar2 != OT_TABLE) {
        pSVar6 = GetTypeName(self);
        pSVar7 = GetTypeName(key);
        Raise_Error(this,"indexing %s with %s",pSVar6,pSVar7);
        return false;
      }
      pSVar8 = (self->super_SQObject)._unVal.pTable;
      if ((pSVar8->super_SQDelegable)._delegate != (SQTable *)0x0) {
        res.super_SQObject._unVal.pTable = (SQTable *)0x0;
        res.super_SQObject._type = OT_NULL;
        res.super_SQObject._flags = '\0';
        res.super_SQObject._5_3_ = 0;
        bVar3 = SQTable::Get(pSVar8,key,&res);
        bVar9 = true;
        bVar4 = true;
        if (!bVar3) {
          closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
          closure.super_SQObject._type = OT_NULL;
          closure.super_SQObject._flags = '\0';
          closure.super_SQObject._5_3_ = 0;
          pSVar8 = (self->super_SQObject)._unVal.pTable;
          if ((pSVar8->super_SQDelegable)._delegate != (SQTable *)0x0) {
            iVar5 = (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                      _vptr_SQRefCounted[6])(pSVar8,this,0xd,&closure);
            bVar4 = true;
            if ((char)iVar5 != '\0') {
              Push(this,self);
              Push(this,key);
              Push(this,val);
              bVar4 = CallMetaMethod(this,&closure,mm,3,&res);
              bVar9 = !bVar4;
            }
          }
          SQObjectPtr::~SQObjectPtr(&closure);
        }
        SQObjectPtr::~SQObjectPtr(&res);
        if (bVar4 == false) {
          return false;
        }
        if (!bVar9) goto LAB_00139abf;
        pSVar8 = (self->super_SQObject)._unVal.pTable;
      }
      SQTable::NewSlot(pSVar8,key,val);
    }
LAB_00139abf:
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool SQVM::NewSlot(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    if (self._flags & SQOBJ_FLAG_IMMUTABLE) {
        Raise_Error(_SC("trying to modify immutable '%s'"),GetTypeName(self));
        return false;
    }

    if(sq_type(key) == OT_NULL) { Raise_Error(_SC("null cannot be used as index")); return false; }
    switch(sq_type(self)) {
    case OT_TABLE: {
        bool rawcall = true;
        if(_table(self)->_delegate) {
            SQObjectPtr res;
            if(!_table(self)->Get(key,res)) {
                SQObjectPtr closure;
                if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
                    Push(self);Push(key);Push(val);
                    if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                        return false;
                    }
                    rawcall = false;
                }
                else {
                    rawcall = true;
                }
            }
        }
        if(rawcall) _table(self)->NewSlot(key,val); //cannot fail

        break;}
    case OT_INSTANCE: {
        SQObjectPtr res;
        SQObjectPtr closure;
        if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
            Push(self);Push(key);Push(val);
            if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                return false;
            }
            break;
        }
        Raise_Error(_SC("class instances do not support the new slot operator"));
        return false;
        break;}
    case OT_CLASS:
        if(!_class(self)->NewSlot(_ss(this),key,val,bstatic)) {
            if(_class(self)->isLocked()) {
                Raise_Error(_SC("trying to modify a class that has already been instantiated, inherited or is locked manually"));
                return false;
            }
            else {
                SQObjectPtr oval = PrintObjVal(key);
                Raise_Error(_SC("the property '%s' already exists"),_stringval(oval));
                return false;
            }
        }
        break;
    default:
        Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key));
        return false;
        break;
    }
    return true;
}